

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallIndirect
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          CallIndirect *curr)

{
  char **this_00;
  uintptr_t uVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  ExpressionRunner<wasm::ModuleRunner> *pEVar5;
  Literal *this_01;
  ModuleRunner *pMVar6;
  Literals local_178;
  undefined1 local_139;
  size_t local_138;
  char *pcStack_130;
  undefined1 local_120 [8];
  TableInterfaceInfo info;
  Type type;
  undefined1 local_f8 [4];
  Index index;
  Flow target;
  undefined1 local_a0 [8];
  Flow flow;
  Literals arguments;
  CallIndirect *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_a0,pEVar5,&curr->operands,(Literals *)this_00);
  bVar3 = Flow::breaking((Flow *)local_a0);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
    target.breakTo.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit((Flow *)local_f8,pEVar5,curr->target);
    bVar3 = Flow::breaking((Flow *)local_f8);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_f8);
    }
    else {
      this_01 = Flow::getSingleValue((Flow *)local_f8);
      uVar4 = wasm::Literal::geti32(this_01);
      if ((curr->isReturn & 1U) == 0) {
        info.name.super_IString.str._M_str =
             (char *)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type
                     .id;
      }
      else {
        info.name.super_IString.str._M_str = (char *)Function::getResults(this->scope->function);
      }
      local_138 = (curr->table).super_IString.str._M_len;
      pcStack_130 = (curr->table).super_IString.str._M_str;
      getTableInterfaceInfo
                ((TableInterfaceInfo *)local_120,this,(Name)(curr->table).super_IString.str);
      pcVar2 = info.name.super_IString.str._M_str;
      local_139 = 0;
      uVar1 = (curr->heapType).id;
      pMVar6 = self(this);
      (*(*(_func_int ***)local_120)[5])
                (&local_178,local_120,info.interface,info.name.super_IString.str._M_len,(ulong)uVar4
                 ,uVar1,&flow.breakTo.super_IString.str._M_str,pcVar2,pMVar6);
      Flow::Flow(__return_storage_ptr__,&local_178);
      Literals::~Literals(&local_178);
      if ((curr->isReturn & 1U) != 0) {
        wasm::Name::operator=(&__return_storage_ptr__->breakTo,(Name *)RETURN_FLOW);
      }
      local_139 = 1;
    }
    target.breakTo.super_IString.str._M_str._0_4_ = 1;
    Flow::~Flow((Flow *)local_f8);
  }
  Flow::~Flow((Flow *)local_a0);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallIndirect(CallIndirect* curr) {
    NOTE_ENTER("CallIndirect");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }

    Index index = target.getSingleValue().geti32();
    Type type = curr->isReturn ? scope->function->getResults() : curr->type;

    auto info = getTableInterfaceInfo(curr->table);
    Flow ret = info.interface->callTable(
      info.name, index, curr->heapType, arguments, type, *self());

    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }